

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defyx.cpp
# Opt level: O1

defyx_dataset * defyx_alloc_dataset(defyx_flags flags)

{
  defyx_dataset *pdVar1;
  uint8_t *puVar2;
  
  pdVar1 = (defyx_dataset *)operator_new(0x10);
  pdVar1->memory = (uint8_t *)0x0;
  pdVar1->dealloc = (DatasetDeallocFunc *)0x0;
  if ((flags & RANDOMX_FLAG_LARGE_PAGES) == RANDOMX_FLAG_DEFAULT) {
    pdVar1->dealloc = defyx::deallocDataset<defyx::AlignedAllocator<64ul>>;
    puVar2 = (uint8_t *)defyx::AlignedAllocator<64UL>::allocMemory(0x3ffffc0);
  }
  else {
    pdVar1->dealloc = defyx::deallocDataset<defyx::LargePageAllocator>;
    puVar2 = (uint8_t *)defyx::LargePageAllocator::allocMemory(0x3ffffc0);
  }
  pdVar1->memory = puVar2;
  return pdVar1;
}

Assistant:

defyx_dataset *defyx_alloc_dataset(defyx_flags flags) {

		//fail on 32-bit systems if DatasetSize is >= 4 GiB
		if (defyx::DatasetSize > std::numeric_limits<size_t>::max()) {
			return nullptr;
		}

		defyx_dataset *dataset;

		try {
			dataset = new defyx_dataset();
			if (flags & RANDOMX_FLAG_LARGE_PAGES) {
				dataset->dealloc = &defyx::deallocDataset<defyx::LargePageAllocator>;
				dataset->memory = (uint8_t*)defyx::LargePageAllocator::allocMemory(defyx::DatasetSize);
			}
			else {
				dataset->dealloc = &defyx::deallocDataset<defyx::DefaultAllocator>;
				dataset->memory = (uint8_t*)defyx::DefaultAllocator::allocMemory(defyx::DatasetSize);
			}
		}
		catch (std::exception &ex) {
			if (dataset != nullptr) {
				defyx_release_dataset(dataset);
				dataset = nullptr;
			}
		}

		return dataset;
	}